

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

double uprv_fmin_63(double x,double y)

{
  UBool UVar1;
  double local_28;
  double y_local;
  double x_local;
  
  UVar1 = uprv_isNaN_63(x);
  if ((UVar1 == '\0') && (UVar1 = uprv_isNaN_63(y), UVar1 == '\0')) {
    if (((x != 0.0) || (((NAN(x) || (y != 0.0)) || (NAN(y))))) ||
       (UVar1 = u_signBit(y), x_local = y, UVar1 == '\0')) {
      local_28 = x;
      if (y < x) {
        local_28 = y;
      }
      x_local = local_28;
    }
  }
  else {
    x_local = uprv_getNaN_63();
  }
  return x_local;
}

Assistant:

U_CAPI double U_EXPORT2
uprv_fmin(double x, double y)
{
#if IEEE_754
    /* first handle NaN*/
    if(uprv_isNaN(x) || uprv_isNaN(y))
        return uprv_getNaN();

    /* check for -0 and 0*/
    if(x == 0.0 && y == 0.0 && u_signBit(y))
        return y;

#endif

    /* this should work for all flt point w/o NaN and Inf special cases */
    return (x > y ? y : x);
}